

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O2

void workspace_destroy(workspace *workspace)

{
  list *plVar1;
  
  plVar1 = workspace->clients;
  if (plVar1 != (list *)0x0) {
    while (plVar1 = (list *)plVar1->head, plVar1 != (list *)0x0) {
      client_destroy((client *)plVar1->size);
    }
    list_destroy(workspace->clients);
  }
  free(workspace);
  return;
}

Assistant:

void workspace_destroy(struct workspace *workspace)
{
        if (workspace->clients != NULL) {
                LIST_FOR_EACH(workspace->clients, node)
                {
                        struct client *client = get_client_from_client_node(node);

                        client_destroy(client);
                }

                list_destroy(workspace->clients);
        }

        free(workspace);
}